

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::CollationTailoring::ensureOwnedData(CollationTailoring *this,UErrorCode *errorCode)

{
  UBool UVar1;
  Normalizer2Impl *pNVar2;
  CollationData *pCVar3;
  UErrorCode *size;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  if (this->ownedData == (CollationData *)0x0) {
    size = errorCode;
    pNVar2 = Normalizer2Factory::getNFCImpl(errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pCVar3 = (CollationData *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      if (pCVar3 == (CollationData *)0x0) {
        pCVar3 = (CollationData *)0x0;
      }
      else {
        pCVar3->base = (CollationData *)0x0;
        pCVar3->jamoCE32s = (uint32_t *)0x0;
        pCVar3->ces = (int64_t *)0x0;
        pCVar3->contexts = (UChar *)0x0;
        pCVar3->trie = (UTrie2 *)0x0;
        pCVar3->ce32s = (uint32_t *)0x0;
        pCVar3->nfcImpl = pNVar2;
        pCVar3->numericPrimary = 0x12000000;
        pCVar3->rootElements = (uint32_t *)0x0;
        pCVar3->rootElementsLength = 0;
        pCVar3->ce32sLength = 0;
        pCVar3->cesLength = 0;
        *(undefined8 *)&pCVar3->contextsLength = 0;
        *(undefined8 *)((long)&pCVar3->compressibleBytes + 4) = 0;
        *(undefined8 *)((long)&pCVar3->unsafeBackwardSet + 4) = 0;
        *(undefined8 *)((long)&pCVar3->fastLatinTable + 4) = 0;
        *(undefined8 *)&pCVar3->numScripts = 0;
        *(undefined8 *)((long)&pCVar3->scriptsIndex + 4) = 0;
        *(undefined8 *)((long)&pCVar3->scriptStarts + 4) = 0;
      }
      this->ownedData = pCVar3;
      if (pCVar3 != (CollationData *)0x0) goto LAB_0023ac60;
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    UVar1 = '\0';
  }
  else {
LAB_0023ac60:
    this->data = this->ownedData;
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }